

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O1

int segdmp_open_read(char **dirs,char *dfn,char *ifn,uint32 *out_n_id,segdmp_type_t *out_data_type,
                    uint32 i_n_stream,uint32 *i_vecsize,uint32 i_blksize)

{
  int32 iVar1;
  uint uVar2;
  uint uVar3;
  FILE *pFVar4;
  uint32 *puVar5;
  uint32 *puVar6;
  char *fmt;
  size_t n_elem;
  long lVar7;
  ulong uVar8;
  uint32 uVar9;
  ulong uVar10;
  uint32 swp;
  uint32 s;
  char fn [4097];
  int local_1078;
  uint32 local_1074;
  int local_1070;
  uint local_106c;
  segdmp_type_t *local_1068;
  uint32 *local_1060;
  ulong local_1058;
  char **local_1050;
  char *local_1048;
  char *local_1040;
  char local_1038 [4104];
  
  vecsize = i_vecsize;
  blksize = i_blksize;
  n_seg = (uint32 *)0x0;
  uVar10 = 0xffffffff;
  do {
    uVar9 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar9;
  } while (dirs[uVar10] != (char *)0x0);
  n_stream = i_n_stream;
  local_1068 = out_data_type;
  local_1060 = out_n_id;
  local_1048 = dfn;
  local_1040 = ifn;
  idx_fp = (FILE **)__ckd_calloc__(uVar10,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x189);
  dmp_fp = (FILE **)__ckd_calloc__(uVar10,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x18a);
  dmp_swp = (uint32 *)
            __ckd_calloc__(uVar10,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                           ,0x18b);
  if (uVar9 != 0) {
    uVar3 = 0;
    local_1058 = uVar10;
    local_1050 = dirs;
    do {
      sprintf(local_1038,"%s/%s",dirs[uVar3],local_1040);
      pFVar4 = s3open(local_1038,"rb",dmp_swp + uVar3);
      idx_fp[uVar3] = pFVar4;
      if (pFVar4 == (FILE *)0x0) {
        fmt = "Unable to open index";
        lVar7 = 0x191;
LAB_0010690f:
        err_msg_system(ERR_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                       ,lVar7,fmt);
LAB_0010691b:
        exit(1);
      }
      iVar1 = bio_fread(&cur_type,4,1,pFVar4,dmp_swp[uVar3],&ignore);
      if (iVar1 != 1) {
        fmt = "unable to read seg idx file";
        lVar7 = 0xc9;
        goto LAB_0010690f;
      }
      iVar1 = bio_fread(&n_id,4,1,idx_fp[uVar3],dmp_swp[uVar3],&ignore);
      if (iVar1 != 1) {
        fmt = "Unable to read index file";
        lVar7 = 0xcd;
        goto LAB_0010690f;
      }
      iVar1 = bio_fread(&local_1078,4,1,idx_fp[uVar3],dmp_swp[uVar3],&ignore);
      if (iVar1 != 1) {
        fmt = "Unable to read index file";
        lVar7 = 0xd3;
        goto LAB_0010690f;
      }
      if ((local_1078 == 0) && (n_frame == (uint32 **)0x0)) {
        n_frame = (uint32 **)
                  __ckd_calloc__((ulong)n_id,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                 ,0xd9);
      }
      if (n_seg == (uint32 *)0x0) {
        n_seg = (uint32 *)
                __ckd_calloc__((ulong)n_id,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                               ,0xdd);
      }
      if (id_part == (uint32 *)0x0) {
        id_part = (uint32 *)
                  __ckd_calloc__((ulong)n_id,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                 ,0xe1);
        id_off = (uint32 *)
                 __ckd_calloc__((ulong)n_id,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                ,0xe2);
        id_len = (uint32 *)
                 __ckd_calloc__((ulong)n_id,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                ,0xe3);
      }
      iVar1 = bio_fread(&frame_sz,4,1,idx_fp[uVar3],dmp_swp[uVar3],&ignore);
      if (iVar1 != 1) {
        fmt = "Unable to read index file";
        lVar7 = 0xe7;
        goto LAB_0010690f;
      }
      iVar1 = bio_fread(&local_106c,4,1,idx_fp[uVar3],dmp_swp[uVar3],&ignore);
      if (iVar1 != 1) {
        fmt = "Unable to read index file";
        lVar7 = 0xed;
        goto LAB_0010690f;
      }
      iVar1 = bio_fread(&local_1070,4,1,idx_fp[uVar3],dmp_swp[uVar3],&ignore);
      if (iVar1 != 1) {
        fmt = "Unable to read index file";
        lVar7 = 0xf3;
        goto LAB_0010690f;
      }
      uVar10 = (ulong)local_106c;
      uVar2 = local_1070 + local_106c;
      if (local_106c < uVar2) {
        do {
          id_part[uVar10] = uVar3;
          iVar1 = bio_fread(n_seg + uVar10,4,1,idx_fp[uVar3],dmp_swp[uVar3],&ignore);
          if (iVar1 != 1) {
            fmt = "Unable to read index file";
            lVar7 = 0xfe;
            goto LAB_0010690f;
          }
          iVar1 = bio_fread(id_off + uVar10,4,1,idx_fp[uVar3],dmp_swp[uVar3],&ignore);
          if (iVar1 != 1) {
            fmt = "Unable to read index file";
            lVar7 = 0x104;
            goto LAB_0010690f;
          }
          if (local_1078 == 0) {
            if ((ulong)n_seg[uVar10] == 0) {
              puVar5 = (uint32 *)0x0;
            }
            else {
              puVar5 = (uint32 *)
                       __ckd_calloc__((ulong)n_seg[uVar10],4,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                      ,0x10b);
            }
            n_frame[uVar10] = puVar5;
            if (n_seg[uVar10] != 0) {
              lVar7 = 0;
              uVar8 = 0;
              do {
                iVar1 = bio_fread((void *)((long)n_frame[uVar10] + lVar7),4,1,idx_fp[uVar3],
                                  dmp_swp[uVar3],&ignore);
                if (iVar1 != 1) {
                  fmt = "Unable to read index file";
                  lVar7 = 0x113;
                  goto LAB_0010690f;
                }
                uVar8 = uVar8 + 1;
                lVar7 = lVar7 + 4;
              } while (uVar8 < n_seg[uVar10]);
            }
          }
          else if (n_frame != (uint32 **)0x0) {
            ckd_free(n_frame);
            n_frame = (uint32 **)0x0;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar2);
      }
      dirs = local_1050;
      sprintf(local_1038,"%s/%s",local_1050[uVar3],local_1048);
      pFVar4 = s3open(local_1038,"rb",&local_1074);
      dmp_fp[uVar3] = pFVar4;
      if (pFVar4 == (FILE *)0x0) {
        fmt = "Unable to open dmp";
        lVar7 = 0x199;
        goto LAB_0010690f;
      }
      uVar9 = (uint32)local_1058;
      if (local_1074 != dmp_swp[uVar3]) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                ,0x19c,"Dmp and index assumed to have same byte-order, but they don\'t\n");
        goto LAB_0010691b;
      }
      uVar3 = uVar3 + 1;
    } while (uVar9 != uVar3);
  }
  n_part = uVar9;
  *local_1068 = cur_type;
  *local_1060 = n_id;
  puVar6 = (uint32 *)
           __ckd_calloc__((ulong)n_id,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                          ,0x1a5);
  puVar5 = id_off;
  n_elem = (size_t)n_id;
  id_nxt_off = puVar6;
  if (n_id != 0) {
    uVar10 = 0;
    do {
      puVar6[uVar10] = puVar5[uVar10];
      uVar10 = uVar10 + 1;
      n_elem = (size_t)n_id;
    } while (uVar10 < n_elem);
  }
  nxt_seg = (uint32 *)
            __ckd_calloc__(n_elem,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                           ,0x1a9);
  return 0;
}

Assistant:

int
segdmp_open_read(const char **dirs,		/* directories available for dump files */
		 const char *dfn,		/* dump file name */
		 const char *ifn,		/* index file name */
		 uint32 *out_n_id,		/* # of segment id's (i.e. phones, states, etc.)*/
		 segdmp_type_t *out_data_type, /* type of data to store in segment dump */
		 uint32 i_n_stream,
		 uint32* i_vecsize,
		 uint32 i_blksize)	
{
    char fn[MAXPATHLEN+1];
    uint32 n_dir;
    uint32 i, swp;
    uint32 *n_frame;
    
    n_stream = i_n_stream;
    vecsize = i_vecsize;
    blksize = i_blksize;
    
    n_seg = NULL;
    n_frame = NULL;

    for (i = 0; dirs[i]; i++);
    n_dir = i;

    idx_fp = ckd_calloc(n_dir, sizeof(FILE *));
    dmp_fp = ckd_calloc(n_dir, sizeof(FILE *));
    dmp_swp = ckd_calloc(n_dir, sizeof(uint32));

    for (i = 0; i < n_dir; i++) {
	sprintf(fn, "%s/%s", dirs[i], ifn);
	idx_fp[i] = s3open(fn, "rb", &dmp_swp[i]);
	if (idx_fp[i] == NULL) {
	    E_FATAL_SYSTEM("Unable to open index");
	}

	read_idx(i);

	sprintf(fn, "%s/%s", dirs[i], dfn);
	dmp_fp[i] = s3open(fn, "rb", &swp);
	if (dmp_fp[i] == NULL) {
	    E_FATAL_SYSTEM("Unable to open dmp");
	}
	if (swp != dmp_swp[i]) {
	    E_FATAL("Dmp and index assumed to have same byte-order, but they don't\n");
	}
    }

    n_part = n_dir;

    *out_data_type = cur_type;
    *out_n_id = n_id;

    id_nxt_off = ckd_calloc(n_id, sizeof(uint32));
    for (i = 0; i < n_id; i++) {
	id_nxt_off[i] = id_off[i];
    }
    nxt_seg    = ckd_calloc(n_id, sizeof(uint32));

    return S3_SUCCESS;
}